

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

PaddingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_padding(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 200) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 200;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    PaddingLayerParams::PaddingLayerParams(this_00.padding_);
    (this->layer_).padding_ = (PaddingLayerParams *)this_00;
  }
  return (PaddingLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::PaddingLayerParams* NeuralNetworkLayer::mutable_padding() {
  if (!has_padding()) {
    clear_layer();
    set_has_padding();
    layer_.padding_ = new ::CoreML::Specification::PaddingLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.padding)
  return layer_.padding_;
}